

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex(PaHostApiTypeId type)

{
  int local_14;
  PaHostApiIndex local_10;
  int i;
  PaHostApiIndex result;
  PaHostApiTypeId type_local;
  
  if (initializationCount_ == 0) {
    local_10 = -10000;
  }
  else {
    local_10 = -0x26fb;
    for (local_14 = 0; local_14 < hostApisCount_; local_14 = local_14 + 1) {
      if ((hostApis_[local_14]->info).type == type) {
        return local_14;
      }
    }
  }
  return local_10;
}

Assistant:

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex( PaHostApiTypeId type )
{
    PaHostApiIndex result;
    int i;
    
    PA_LOGAPI_ENTER_PARAMS( "Pa_HostApiTypeIdToHostApiIndex" );
    PA_LOGAPI(("\tPaHostApiTypeId type: %d\n", type ));

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;
        
        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                result = i;
                break;
            }         
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_HostApiTypeIdToHostApiIndex", "PaHostApiIndex: %d", result );

    return result;
}